

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O3

int do_stackoverflow(int incallp)

{
  DLword DVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  DLword *pDVar5;
  DLword DVar6;
  ushort uVar7;
  StackWord SVar8;
  int iVar9;
  StackWord *pSVar10;
  DLword *pDVar11;
  DLword *pDVar12;
  DLword *pDVar13;
  uint uVar14;
  StackWord *pSVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ushort *puVar19;
  StackWord *start68k;
  long lVar20;
  undefined2 *puVar21;
  ushort *puVar22;
  StackWord *pSVar23;
  
  pDVar5 = MachineState.pvar;
  if (*NeedHardreturnCleanup_word != 0) {
    warn("HardreturnCleanup in do_stackoverflow");
  }
  if (incallp == 0) {
    DVar1 = 0;
  }
  else {
    DVar1 = MachineState.pvar[-5];
  }
  MachineState.csp = MachineState.csp + 2;
  uVar18 = (long)MachineState.csp - (long)Stackspace >> 1;
  if (0xffff < uVar18) {
    printf("Stack offset is out of range: 0x%tx\n",uVar18);
  }
  MachineState.pvar[-5] = (DLword)uVar18;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("0-long free block.");
  }
  pDVar12 = MachineState.pvar;
  start68k = (StackWord *)(MachineState.pvar + -10);
  uVar7 = MachineState.pvar[-5];
  DVar6 = uVar7;
  if (((ulong)start68k & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",start68k);
    DVar6 = pDVar12[-5];
  }
  uVar17 = (uint)uVar7 - ((uint)((int)start68k - (int)Lisp_world) >> 1 & 0xffff);
  uVar14 = uVar17 + 2;
  puVar22 = (ushort *)((ulong)((uint)DVar6 * 2) + (long)Stackspace);
  bVar4 = false;
  bVar3 = false;
  while( true ) {
    if (puVar22[1] == 0xa000) {
      uVar18 = (ulong)*puVar22;
      puVar19 = puVar22 + uVar18;
      if (puVar19[1] == 0xa000) goto LAB_0012b0dc;
      uVar18 = (long)puVar19 - (long)Stackspace >> 1;
      if (0xffff < uVar18) {
        printf("Stack offset is out of range: 0x%tx\n",uVar18);
      }
      if (InterfacePage->endofstack == (DLword)uVar18) {
        uVar18 = (long)puVar19 - (long)Stackspace >> 1;
        if (0xffff < uVar18) {
          printf("Stack offset is out of range: 0x%tx\n",uVar18);
        }
        if ((((uint)uVar18 & 0xffff) <= (uint)(ushort)*GuardStackAddr_word) ||
           (bVar3 = true, *STACKOVERFLOW_word != 0)) {
          pDVar12 = extendstack();
          if (pDVar12 != (DLword *)0x0) goto LAB_0012b24c;
          goto LAB_0012b280;
        }
      }
    }
    uVar16 = 0xffffffff;
    if (((*pDVar12 & 0x200000000000000) != 0) && (pDVar12[-3] == 1)) {
      if (((ulong)start68k & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",start68k);
      }
      uVar16 = (uint)((int)start68k - (int)Lisp_world) >> 1 & 3 ^ 2;
      bVar4 = true;
    }
    pSVar10 = (StackWord *)freestackblock((DLword)uVar14,start68k,uVar16);
    if (pSVar10 == (StackWord *)0x0) goto LAB_0012b280;
    if (pSVar10 < Stackspace) {
      error("freestackblock returned gunk.");
    }
    if ((!bVar3) || (pSVar10 <= start68k)) break;
    pSVar10[1] = (StackWord)0xa000;
    bVar3 = true;
    if (*pSVar10 == (StackWord)0x0) {
      error("0-long stack freeblock.");
    }
  }
  if (uVar14 != 0) {
    pDVar11 = pDVar12 + (long)(int)uVar14 + -0xd;
    pSVar15 = pSVar10 + (int)uVar14;
    uVar16 = uVar14;
    do {
      pSVar15 = pSVar15 + -1;
      puVar21 = (undefined2 *)((ulong)pDVar11 ^ 2);
      pDVar11 = pDVar11 + -1;
      *(undefined2 *)((ulong)pSVar15 ^ 2) = *puVar21;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  pSVar10[1].field_0x1 = pSVar10[1].field_0x1 | 2;
  pSVar15 = pSVar10 + 2;
  uVar18 = (long)pSVar15 - (long)Stackspace >> 1;
  if (0xffff < uVar18) {
    printf("Stack offset is out of range: 0x%tx\n",uVar18);
  }
  pSVar23 = (StackWord *)(pDVar12 + -0xc);
  pSVar10[7] = (StackWord)((short)uVar18 + (short)uVar17);
  if (((ushort)*start68k & 1) == 0) {
    if (((ulong)pSVar23 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pSVar23);
    }
    SVar8 = SUB42((uint)((int)pSVar23 - (int)Lisp_world) >> 1,0);
  }
  else {
    SVar8 = *(StackWord *)(pDVar12 + -1);
  }
  pSVar10[0xb] = SVar8;
  uVar16 = *(uint *)(pSVar10 + 2);
  if ((uVar16 & 1) == 0) {
    pSVar10[10] = SUB42(uVar16,0);
    *(uint *)(pSVar10 + 2) = uVar16 | 1;
  }
  if (bVar4) {
    *(int *)(pSVar10 + 8) =
         *(int *)(pSVar10 + 8) + (int)((ulong)((long)pSVar15 - (long)start68k) >> 1);
  }
  if ((*pDVar12 & 0x2000000) == 0) {
    uVar14 = uVar17;
    if ((int)uVar17 < 1) {
      error("creating 0 length free stack block");
    }
  }
  else {
    start68k = pSVar23;
    if ((int)uVar17 < -1) {
      error("creating 0 length free stack block");
    }
  }
  if ((uVar17 & 1) != 0) {
    error("creating odd length free stack block");
  }
  *(uint *)start68k = uVar14 & 0xffff | 0xa0000000;
  start68k = pSVar15;
LAB_0012b24c:
  lVar20 = (long)start68k - (long)Stackspace;
  uVar18 = lVar20 >> 1;
  if (0xffff < uVar18) {
    printf("Stack offset is out of range: 0x%tx\n",uVar18);
  }
  if ((~(uint)lVar20 & 0x1fffe) == 0) {
LAB_0012b280:
    MachineState.irqcheck = 0;
    MachineState.irqend = 0;
    iVar9 = 1;
  }
  else {
    uVar14 = (int)uVar18 + 10;
    uVar17 = uVar14 & 0xffff;
    if ((uVar14 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)uVar17);
    }
    pDVar12 = Stackspace + uVar17;
    pDVar11 = Stackspace + pDVar12[-5];
    pDVar13 = pDVar11;
    MachineState.pvar = pDVar12;
    if (*(short *)((ulong)pDVar11 ^ 2) == -0x6000) goto LAB_0012b2fd;
    error("pre_moveframe: MP9316");
    sVar2 = *(short *)((ulong)pDVar11 ^ 2);
    while (sVar2 == -0x6000) {
LAB_0012b2fd:
      pDVar13 = pDVar13 + *(ushort *)((ulong)(pDVar13 + 1) ^ 2);
      MachineState.endofstack = pDVar13;
      sVar2 = *(short *)((ulong)pDVar13 ^ 2);
    }
    MachineState.csp = pDVar11 + -2;
    iVar9 = 0;
    if (incallp != 0) {
      uVar18 = (ulong)((long)pDVar12 - (long)pDVar5) >> 1;
      MachineState.pvar[-5] = DVar1 + (short)uVar18;
      MachineState.ivar = MachineState.ivar + (int)uVar18;
      iVar9 = 0;
    }
  }
  return iVar9;
LAB_0012b0dc:
  do {
    uVar7 = (short)uVar18 + *puVar19;
    uVar18 = (ulong)uVar7;
    *puVar22 = uVar7;
    puVar19 = puVar19 + *puVar19;
  } while (puVar19[1] == 0xa000);
  goto LAB_0012b24c;
}

Assistant:

int do_stackoverflow(int incallp) {
  DLword newfx;
  DLword savenext;
  DLword *oldPVar;
  int movedistance;
#ifdef STACKCHECK
  LispPTR stackcontents;
  LispPTR TopIVAR;

  stackcontents = *((LispPTR *)CurrentStackPTR);
  TopIVAR = *((LispPTR *)IVar);
#endif

  /* Don't care PC,FuncObj, */
  /* if incall flag ON, don't care that IVar
       became residual, and it is pointed to by copied FX's BLINK */
  oldPVar = PVar;

  if (*NeedHardreturnCleanup_word) { warn("HardreturnCleanup in do_stackoverflow"); }
  if (incallp) { savenext = CURRENTFX->nextblock; /* save old nextblock */ }

  BEFORE_CONTEXTSW; /* Don't Use MIDPUNT and Don't care IFPAGE */

  /* Call MOVEFRAME directly */
  if ((newfx = (DLword)moveframe(CURRENTFX)) == 0xFFFF) {
    /* To make immediately call HARDRESET */
    Irq_Stk_Check = 0;
    Irq_Stk_End = 0;
    return (1); /* Whole space exhausted */
  }

  /* Return from MOVEFRAME directly */

  PVar = (DLword *)NativeAligned4FromStackOffset(newfx + FRAMESIZE);
  movedistance = ((UNSIGNED)PVar - (UNSIGNED)oldPVar) >> 1;
  AFTER_CONTEXTSW;

  if (incallp) {
    /* set next(it pointed to old IVar) with offset */
    CURRENTFX->nextblock = savenext + movedistance;

/* including Last Arg(kept in TOS */
#ifdef BIGVM
    S_CHECK(FuncObj == (struct fnhead *)NativeAligned4FromLAddr(CURRENTFX->fnheader),
            "in call, but stack frame doesn't match FN being executed.");
#else
    S_CHECK(FuncObj == (struct fnhead *)NativeAligned4FromLAddr((CURRENTFX->hi2fnheader << 16) |
                                                           CURRENTFX->lofnheader),
            "in call, but stack frame doesn't match FN being executed.");
#endif /* BIGVM */
    CHECK_FX(CURRENTFX);

    /* We should re-Set up IVAR,CURRENTFX->nextblock */
    IVar += movedistance;
  } /* incallp */

  return (0); /* Normal return */
  /* If  incallp ,we CAN continue executing FN or APPLY by just returning */
  /* new PVar will set in funcall */
}